

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_clear(void)

{
  uint uVar1;
  uint uVar2;
  term_win *ptVar3;
  int *piVar4;
  wchar_t *pwVar5;
  int *piVar6;
  wchar_t *pwVar7;
  term *ptVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  ptVar8 = Term;
  uVar1 = Term->wid;
  uVar2 = Term->hgt;
  ptVar3 = Term->scr;
  ptVar3->cu = false;
  ptVar3->cx = 0;
  ptVar3->cy = 0;
  uVar10 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar10;
  }
  uVar11 = 0;
  if (0 < (int)uVar2) {
    uVar11 = (ulong)uVar2;
  }
  for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
    piVar4 = ptVar3->a[uVar10];
    pwVar5 = ptVar3->c[uVar10];
    piVar6 = ptVar3->ta[uVar10];
    pwVar7 = ptVar3->tc[uVar10];
    for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      piVar4[uVar12] = 1;
      pwVar5[uVar12] = L' ';
      piVar6[uVar12] = 0;
      pwVar7[uVar12] = L'\0';
    }
    ptVar8->x1[uVar10] = 0;
    ptVar8->x2[uVar10] = uVar1 - 1;
  }
  ptVar8->y1 = 0;
  ptVar8->y2 = uVar2 - 1;
  ptVar8->total_erase = true;
  return 0;
}

Assistant:

errr Term_clear(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	/* Cursor usable */
	Term->scr->cu = 0;

	/* Cursor to the top left */
	Term->scr->cx = Term->scr->cy = 0;

	/* Wipe each row */
	for (y = 0; y < h; y++) {
		int *scr_aa = Term->scr->a[y];
		wchar_t *scr_cc = Term->scr->c[y];
		int *scr_taa = Term->scr->ta[y];
		wchar_t *scr_tcc = Term->scr->tc[y];

		/* Wipe each column */
		for (x = 0; x < w; x++) {
			scr_aa[x] = COLOUR_WHITE;
			scr_cc[x] = ' ';

			scr_taa[x] = 0;
			scr_tcc[x] = 0;
		}

		/* This row has changed */
		Term->x1[y] = 0;
		Term->x2[y] = w - 1;
	}

	/* Every row has changed */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Success */
	return (0);
}